

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compact_hash_table.hpp
# Opt level: O0

uint64_t __thiscall
poplar::compact_hash_table<7U,_80U,_poplar::bijective_hash::split_mix_hasher>::get
          (compact_hash_table<7U,_80U,_poplar::bijective_hash::split_mix_hasher> *this,uint64_t key)

{
  bool bVar1;
  compact_hash_table<7U,_80U,_poplar::bijective_hash::split_mix_hasher> *this_00;
  compact_hash_table<7U,_80U,_poplar::bijective_hash::split_mix_hasher> *this_01;
  uint64_t in_RDI;
  uint64_t slot_id;
  type_conflict *mod;
  type_conflict *quo;
  compact_hash_table<7U,_80U,_poplar::bijective_hash::split_mix_hasher> *in_stack_ffffffffffffffc0;
  undefined1 in_stack_ffffffffffffffd8 [16];
  undefined8 local_8;
  
  bijective_hash::split_mix_hasher::hash(&in_stack_ffffffffffffffc0->hasher_,in_RDI);
  decompose_(in_stack_ffffffffffffffd8._8_8_,in_stack_ffffffffffffffd8._0_8_);
  std::get<0ul,unsigned_long,unsigned_long>((pair<unsigned_long,_unsigned_long> *)0x19bcb1);
  this_00 = (compact_hash_table<7U,_80U,_poplar::bijective_hash::split_mix_hasher> *)
            std::get<1ul,unsigned_long,unsigned_long>
                      ((pair<unsigned_long,_unsigned_long> *)0x19bcc0);
  bVar1 = get_vbit_(in_stack_ffffffffffffffc0,in_RDI);
  if (bVar1) {
    this_01 = (compact_hash_table<7U,_80U,_poplar::bijective_hash::split_mix_hasher> *)
              find_ass_cbit_(in_stack_ffffffffffffffc0,in_RDI);
    if (this_01 ==
        (compact_hash_table<7U,_80U,_poplar::bijective_hash::split_mix_hasher> *)0xffffffffffffffff)
    {
      local_8 = 0xffffffffffffffff;
    }
    else {
      bVar1 = find_item_(this_00,(uint64_t *)this_01,in_RDI);
      if (bVar1) {
        local_8 = get_val_(this_01,in_RDI);
      }
      else {
        local_8 = 0xffffffffffffffff;
      }
    }
  }
  else {
    local_8 = 0xffffffffffffffff;
  }
  return local_8;
}

Assistant:

uint64_t get(uint64_t key) const {
        assert(key < univ_size_.size());

        auto [quo, mod] = decompose_(hasher_.hash(key));

        if (!get_vbit_(mod)) {
            return nil;
        }

        uint64_t slot_id = find_ass_cbit_(mod);
        if (slot_id == UINT64_MAX) {
            return nil;
        }

        if (!find_item_(slot_id, quo)) {
            return nil;
        }
        return get_val_(slot_id);
    }